

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

ImfLut * ImfNewRoundNBitLut(uint n,int channels)

{
  RgbaLut *this;
  
  this = (RgbaLut *)operator_new(0x10);
  Imf_3_4::RgbaLut::RgbaLut<Imf_3_4::roundNBit>(this,(roundNBit)n,channels);
  return (ImfLut *)this;
}

Assistant:

ImfLut*
ImfNewRoundNBitLut (unsigned int n, int channels)
{
    try
    {
        return (ImfLut*) new OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaLut (
            OPENEXR_IMF_INTERNAL_NAMESPACE::roundNBit (n),
            OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaChannels (channels));
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}